

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                (ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
                unsigned_long_long v_max,bool is_logarithmic,float logarithmic_zero_epsilon,
                float zero_deadzone_halfsize)

{
  ulong in_RCX;
  ulong in_RDX;
  unsigned_long_long in_RSI;
  byte in_R8B;
  bool bVar1;
  float in_XMM0_Da;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float in_XMM1_Da;
  undefined1 auVar9 [16];
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float result;
  double v_max_fudged;
  double v_min_fudged;
  bool flipped;
  unsigned_long_long v_clamped;
  float local_124;
  float local_108;
  float local_100;
  float local_e4;
  float local_dc;
  float local_cc;
  float local_c4;
  float local_bc;
  float local_b4;
  float local_ac;
  float local_a4;
  float local_9c;
  double local_98;
  float local_8c;
  float local_84;
  double local_80;
  float local_74;
  float local_6c;
  unsigned_long_long local_68;
  float local_54;
  double local_50;
  double local_48;
  ulong local_20;
  ulong local_18;
  unsigned_long_long local_10;
  float local_4;
  undefined4 uVar10;
  
  if (in_RDX == in_RCX) {
    local_4 = 0.0;
  }
  else {
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    if (in_RDX < in_RCX) {
      local_68 = ImClamp<unsigned_long_long>(in_RSI,in_RDX,in_RCX);
    }
    else {
      local_68 = ImClamp<unsigned_long_long>(in_RSI,in_RCX,in_RDX);
    }
    if ((in_R8B & 1) == 0) {
      local_4 = (float)((double)(long)(local_68 - local_18) / (double)(long)(local_20 - local_18));
    }
    else {
      bVar1 = local_20 < local_18;
      if (bVar1) {
        ImSwap<unsigned_long_long>(&local_18,&local_20);
      }
      auVar4._8_4_ = (int)(local_18 >> 0x20);
      auVar4._0_8_ = local_18;
      auVar4._12_4_ = 0x45300000;
      dVar2 = ImAbs((auVar4._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0));
      if ((double)in_XMM0_Da <= dVar2) {
        auVar5._8_4_ = (int)(local_18 >> 0x20);
        auVar5._0_8_ = local_18;
        auVar5._12_4_ = 0x45300000;
        local_80 = (auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0);
      }
      else {
        local_6c = (float)local_18;
        local_74 = in_XMM0_Da;
        if (local_6c < 0.0) {
          local_74 = -in_XMM0_Da;
        }
        local_80 = (double)local_74;
      }
      local_48 = local_80;
      auVar6._8_4_ = (int)(local_20 >> 0x20);
      auVar6._0_8_ = local_20;
      auVar6._12_4_ = 0x45300000;
      dVar2 = ImAbs((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0));
      if ((double)in_XMM0_Da <= dVar2) {
        auVar7._8_4_ = (int)(local_20 >> 0x20);
        auVar7._0_8_ = local_20;
        auVar7._12_4_ = 0x45300000;
        local_98 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0);
      }
      else {
        local_84 = (float)local_20;
        local_8c = in_XMM0_Da;
        if (local_84 < 0.0) {
          local_8c = -in_XMM0_Da;
        }
        local_98 = (double)local_8c;
      }
      local_50 = local_98;
      local_9c = (float)local_18;
      if (((local_9c != 0.0) || (NAN(local_9c))) || (local_a4 = (float)local_20, 0.0 <= local_a4)) {
        local_ac = (float)local_20;
        if (((local_ac == 0.0) && (!NAN(local_ac))) && (local_b4 = (float)local_18, local_b4 < 0.0))
        {
          local_50 = (double)-in_XMM0_Da;
        }
      }
      else {
        local_48 = (double)-in_XMM0_Da;
      }
      uVar10 = (undefined4)(local_68 >> 0x20);
      auVar9._8_4_ = uVar10;
      auVar9._0_8_ = local_68;
      auVar9._12_4_ = 0x45300000;
      if (local_48 <
          (auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) {
        auVar8._8_4_ = uVar10;
        auVar8._0_8_ = local_68;
        auVar8._12_4_ = 0x45300000;
        if ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0) < local_50) {
          local_bc = (float)(local_18 * local_20);
          if (0.0 <= local_bc) {
            local_100 = (float)local_18;
            if ((local_100 < 0.0) || (local_108 = (float)local_20, local_108 < 0.0)) {
              dVar2 = ImLog(8.53080423654372e-318);
              dVar3 = ImLog(8.53119454840393e-318);
              local_54 = 1.0 - (float)(dVar2 / dVar3);
            }
            else {
              dVar2 = ImLog(8.5316737920804e-318);
              dVar3 = ImLog(8.53181707111769e-318);
              local_54 = (float)(dVar2 / dVar3);
            }
          }
          else {
            local_c4 = (float)local_18;
            local_cc = (float)local_20;
            local_54 = -local_c4 / (local_cc - local_c4);
            local_dc = (float)local_10;
            if ((local_dc != 0.0) || (NAN(local_dc))) {
              local_e4 = (float)local_10;
              if (0.0 <= local_e4) {
                dVar2 = ImLog(8.5289761936541e-318);
                dVar3 = ImLog(8.52915899794307e-318);
                local_54 = (float)(dVar2 / dVar3) * (1.0 - (local_54 + in_XMM1_Da)) +
                           local_54 + in_XMM1_Da;
              }
              else {
                dVar2 = ImLog(8.52802758761409e-318);
                dVar3 = ImLog(8.52832402700159e-318);
                local_54 = (1.0 - (float)(dVar2 / dVar3)) * (local_54 - in_XMM1_Da);
              }
            }
          }
        }
        else {
          local_54 = 1.0;
        }
      }
      else {
        local_54 = 0.0;
      }
      if (bVar1) {
        local_124 = 1.0 - local_54;
      }
      else {
        local_124 = local_54;
      }
      local_4 = local_124;
    }
  }
  return local_4;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}